

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O2

void __thiscall MissingDependencyScanner::PrintStats(MissingDependencyScanner *this)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Processed ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," nodes.\n");
  if ((this->nodes_missing_deps_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pcVar2 = "No missing dependencies on generated files found.\n";
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Error: There are ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->missing_dep_path_count_);
    std::operator<<(poVar1," missing dependency paths.\n");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar1 = std::operator<<(poVar1," targets had depfile dependencies on ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," distinct generated inputs ");
    poVar1 = std::operator<<(poVar1,"(from ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," rules) ");
    std::operator<<(poVar1," without a non-depfile dep path to the generator.\n");
    pcVar2 = 
    "There might be build flakiness if any of the targets listed above are built alone, or not late enough, in a clean output directory.\n"
    ;
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  return;
}

Assistant:

void MissingDependencyScanner::PrintStats() {
  std::cout << "Processed " << seen_.size() << " nodes.\n";
  if (HadMissingDeps()) {
    std::cout << "Error: There are " << missing_dep_path_count_
              << " missing dependency paths.\n";
    std::cout << nodes_missing_deps_.size()
              << " targets had depfile dependencies on "
              << generated_nodes_.size() << " distinct generated inputs "
              << "(from " << generator_rules_.size() << " rules) "
              << " without a non-depfile dep path to the generator.\n";
    std::cout << "There might be build flakiness if any of the targets listed "
                 "above are built alone, or not late enough, in a clean output "
                 "directory.\n";
  } else {
    std::cout << "No missing dependencies on generated files found.\n";
  }
}